

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundedQueue.h
# Opt level: O1

void __thiscall Gluco::bqueue<unsigned_int>::push(bqueue<unsigned_int> *this,uint x)

{
  int iVar1;
  int iVar2;
  
  this->expComputed = false;
  if (this->queuesize == this->maxsize) {
    iVar1 = this->last;
    if (iVar1 != this->first) {
      __assert_fail("last==first",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/BoundedQueue.h"
                    ,0x34,"void Gluco::bqueue<unsigned int>::push(T) [T = unsigned int]");
    }
    this->sumofqueue = this->sumofqueue - (ulong)(this->elems).data[iVar1];
    iVar2 = 0;
    if (iVar1 + 1 != this->maxsize) {
      iVar2 = iVar1 + 1;
    }
    this->last = iVar2;
  }
  else {
    this->queuesize = this->queuesize + 1;
  }
  this->sumofqueue = this->sumofqueue + (ulong)x;
  (this->elems).data[this->first] = x;
  iVar1 = this->first + 1;
  this->first = iVar1;
  if (iVar1 == this->maxsize) {
    this->first = 0;
    this->last = 0;
  }
  return;
}

Assistant:

void push(T x) {
      expComputed = false;
        if (queuesize==maxsize) {
            assert(last==first); // The queue is full, next value to enter will replace oldest one
            sumofqueue -= elems[last];
            if ((++last) == maxsize) last = 0;
        } else 
            queuesize++;
        sumofqueue += x;
        elems[first] = x;
        if ((++first) == maxsize) {first = 0;last = 0;}
    }